

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O1

Error asmjit::v1_14::InstAPI::validate
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  Error EVar1;
  
  if ((byte)(arch - k32BitMask) < 2) {
    if (arch == k32BitMask) {
      EVar1 = x86::InstInternal::validateX86(inst,operands,opCount,validationFlags);
      return EVar1;
    }
    EVar1 = x86::InstInternal::validateX64(inst,operands,opCount,validationFlags);
    return EVar1;
  }
  if ((arch != kAArch64_BE) && (arch != kAArch64)) {
    return 4;
  }
  EVar1 = a64::InstInternal::validate(inst,operands,opCount,validationFlags);
  return EVar1;
}

Assistant:

Error InstAPI::validate(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch)) {
    if (arch == Arch::kX86)
      return x86::InstInternal::validateX86(inst, operands, opCount, validationFlags);
    else
      return x86::InstInternal::validateX64(inst, operands, opCount, validationFlags);
  }
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::validate(inst, operands, opCount, validationFlags);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}